

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O0

DataGroup __thiscall
DL::DataLisp_Internal::buildGroup(DataLisp_Internal *this,StatementNode *n,VM *vm)

{
  bool bVar1;
  reference ppDVar2;
  VM *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  DataGroup DVar3;
  undefined1 local_b0 [8];
  Data data;
  DataNode *ptr;
  iterator __end2;
  iterator __begin2;
  vector_t<DataNode_*> *__range2;
  VM *vm_local;
  StatementNode *n_local;
  DataLisp_Internal *this_local;
  DataGroup *group;
  
  if (vm != (VM *)0x0) {
    DataGroup::DataGroup((DataGroup *)this,(string_t *)vm);
    __end2 = std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::begin
                       ((vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_> *)(vm + 2));
    ptr = (DataNode *)
          std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::end
                    ((vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_> *)(vm + 2));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<DL::DataNode_**,_std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>_>
                                       *)&ptr), bVar1) {
      ppDVar2 = __gnu_cxx::
                __normal_iterator<DL::DataNode_**,_std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>_>
                ::operator*(&__end2);
      data._88_8_ = *ppDVar2;
      buildData((Data *)local_b0,(DataLisp_Internal *)n,(DataNode *)data._88_8_,in_RCX);
      bVar1 = Data::isValid((Data *)local_b0);
      if (bVar1) {
        DataGroup::add((DataGroup *)this,(Data *)local_b0);
      }
      Data::~Data((Data *)local_b0);
      __gnu_cxx::
      __normal_iterator<DL::DataNode_**,_std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>_>
      ::operator++(&__end2);
    }
    DVar3.mShared.super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    DVar3.mShared.super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (DataGroup)DVar3.mShared.super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __assert_fail("(n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataLisp.cpp"
                ,0x112,"DataGroup DL::DataLisp_Internal::buildGroup(StatementNode *, VM &)");
}

Assistant:

DataGroup buildGroup(StatementNode* n, VM& vm)
	{
		DL_ASSERT(n);

		DataGroup group(n->Name);
		for (DataNode* ptr : n->Nodes) {
			Data data = buildData(ptr, vm);
			if (data.isValid())
				group.add(data);
		}

		return group;
	}